

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O3

bool __thiscall
double_conversion::ComputeGuess
          (double_conversion *this,Vector<const_char> trimmed,int exponent,double *guess)

{
  double_conversion *pdVar1;
  ulong uVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  undefined4 in_register_0000000c;
  double *pdVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  DiyFp diy_fp;
  DiyFp cached_power;
  int local_44;
  DiyFp local_40;
  
  pdVar7 = (double *)CONCAT44(in_register_0000000c,exponent);
  uVar11 = (uint)trimmed.start_;
  if (uVar11 == 0) goto LAB_00440ec0;
  uVar6 = trimmed.length_;
  iVar3 = uVar6 + uVar11;
  if (0x135 < iVar3) {
    *pdVar7 = INFINITY;
    return true;
  }
  if (iVar3 < -0x143) goto LAB_00440ec0;
  if ((int)uVar11 < 0x10) {
    if (0xffffffe9 < uVar6) {
      if ((int)uVar11 < 1) {
        dVar16 = 0.0;
      }
      else {
        uVar9 = 1;
        uVar12 = 0;
        do {
          uVar12 = ((long)(char)this[uVar9 - 1] + uVar12 * 10) - 0x30;
          if (uVar11 <= uVar9) break;
          uVar9 = uVar9 + 1;
        } while (uVar12 < 0x1999999999999999);
        auVar17._8_4_ = (int)(uVar12 >> 0x20);
        auVar17._0_8_ = uVar12;
        auVar17._12_4_ = 0x45300000;
        dVar16 = (auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
      }
      dVar16 = dVar16 / *(double *)(exact_powers_of_ten + (ulong)-uVar6 * 8);
LAB_0044111d:
      *pdVar7 = dVar16;
      return true;
    }
    if (uVar6 < 0x17) {
      if ((int)uVar11 < 1) {
        dVar16 = 0.0;
      }
      else {
        uVar9 = 1;
        uVar12 = 0;
        do {
          uVar12 = ((long)(char)this[uVar9 - 1] + uVar12 * 10) - 0x30;
          if (uVar11 <= uVar9) break;
          uVar9 = uVar9 + 1;
        } while (uVar12 < 0x1999999999999999);
        auVar18._8_4_ = (int)(uVar12 >> 0x20);
        auVar18._0_8_ = uVar12;
        auVar18._12_4_ = 0x45300000;
        dVar16 = (auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
      }
      dVar16 = dVar16 * *(double *)(exact_powers_of_ten + (ulong)uVar6 * 8);
      goto LAB_0044111d;
    }
    if (-1 < (int)uVar6) {
      iVar5 = uVar6 - (0xf - uVar11);
      if (iVar5 < 0x17) {
        if ((int)uVar11 < 1) {
          dVar16 = 0.0;
        }
        else {
          uVar9 = 1;
          uVar12 = 0;
          do {
            uVar12 = ((long)(char)this[uVar9 - 1] + uVar12 * 10) - 0x30;
            if (uVar11 <= uVar9) break;
            uVar9 = uVar9 + 1;
          } while (uVar12 < 0x1999999999999999);
          auVar19._8_4_ = (int)(uVar12 >> 0x20);
          auVar19._0_8_ = uVar12;
          auVar19._12_4_ = 0x45300000;
          dVar16 = (auVar19._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
        }
        dVar16 = dVar16 * *(double *)(exact_powers_of_ten + (long)(int)(0xf - uVar11) * 8) *
                 *(double *)(exact_powers_of_ten + (long)iVar5 * 8);
        goto LAB_0044111d;
      }
    }
    if (0 < (int)uVar11) goto LAB_00440e23;
    uVar12 = 0;
    uVar9 = 0;
  }
  else {
LAB_00440e23:
    uVar12 = 0;
    uVar9 = 0;
    do {
      pdVar1 = this + uVar12;
      uVar12 = uVar12 + 1;
      uVar9 = ((long)(char)*pdVar1 + uVar9 * 10) - 0x30;
      if (uVar11 <= uVar12) break;
    } while (uVar9 < 0x1999999999999999);
  }
  iVar5 = 0;
  uVar8 = (uint)uVar12;
  if (uVar8 == uVar11) {
    lVar10 = 0;
  }
  else {
    uVar9 = uVar9 + ('4' < (char)this[(int)uVar8]);
    uVar6 = iVar3 - uVar8;
    lVar10 = 4;
  }
  if (uVar9 >> 0x36 == 0) {
    iVar5 = 0;
    uVar12 = uVar9;
    do {
      uVar9 = uVar12 << 10;
      iVar5 = iVar5 + -10;
      bVar15 = uVar12 < 0x100000000000;
      uVar12 = uVar9;
    } while (bVar15);
  }
  for (; -1 < (long)uVar9; uVar9 = uVar9 * 2) {
    iVar5 = iVar5 + -1;
  }
  lVar10 = lVar10 << (-(char)iVar5 & 0x3fU);
  if (-0x15d < (int)uVar6) {
    local_40.f_ = 0;
    local_40.e_ = 0;
    PowersOfTenCache::GetCachedPowerForDecimalExponent(uVar6,&local_40,&local_44);
    local_44 = uVar6 - local_44;
    if (local_44 != 0) {
      uVar6 = local_44 - 1;
      if (6 < uVar6) {
        abort();
      }
      uVar12 = (uVar9 & 0xffffffff) * *(long *)(&DAT_02d11b68 + (ulong)uVar6 * 8);
      iVar5 = iVar5 + *(int *)(&DAT_02d11b48 + (ulong)uVar6 * 4);
      uVar9 = ((ulong)((uint)uVar12 & 0x80000000) + 0x80000000 >> 0x20) +
              (uVar12 >> 0x20) + (uVar9 >> 0x20) * *(long *)(&DAT_02d11b68 + (ulong)uVar6 * 8);
      if ((int)(0x13 - uVar11) < local_44) {
        lVar10 = lVar10 + 4;
      }
    }
    uVar13 = (local_40.f_ >> 0x20) * (uVar9 & 0xffffffff);
    uVar12 = (uVar9 >> 0x20) * (local_40.f_ & 0xffffffff);
    uVar6 = local_40.e_ + iVar5 + 0x40;
    uVar12 = ((uVar13 & 0xffffffff) +
              (uVar12 & 0xffffffff) + ((local_40.f_ & 0xffffffff) * (uVar9 & 0xffffffff) >> 0x20) +
              0x80000000 >> 0x20) +
             (uVar13 >> 0x20) + (uVar12 >> 0x20) + (local_40.f_ >> 0x20) * (uVar9 >> 0x20);
    uVar9 = uVar12;
    uVar11 = uVar6;
    if (uVar12 < 0x40000000000000) {
      do {
        uVar9 = uVar12 << 10;
        uVar11 = uVar11 - 10;
        bVar15 = uVar12 < 0x100000000000;
        uVar12 = uVar9;
      } while (bVar15);
    }
    for (; -1 < (long)uVar9; uVar9 = uVar9 * 2) {
      uVar11 = uVar11 - 1;
    }
    uVar12 = (9 - (ulong)(lVar10 == 0)) + lVar10 << ((char)uVar6 - (char)uVar11 & 0x3fU);
    uVar6 = 0;
    if (0xfffffbce < uVar11 + 0x40) {
      uVar6 = uVar11 + 0x472;
    }
    uVar13 = 0x35;
    if ((int)uVar11 < -0x43d) {
      uVar13 = (ulong)uVar6;
    }
    iVar3 = (int)uVar13;
    if (iVar3 < 4) {
      bVar4 = (byte)(4 - iVar3);
      uVar9 = uVar9 >> (bVar4 & 0x3f);
      uVar11 = (4 - iVar3) + uVar11;
      uVar13 = (ulong)uVar11;
      uVar12 = (uVar12 >> (bVar4 & 0x3f)) + 9;
      iVar3 = 0x3c;
    }
    else {
      iVar3 = 0x40 - iVar3;
    }
    bVar4 = (byte)iVar3;
    uVar14 = (~(-1L << (bVar4 & 0x3f)) & uVar9) << 3;
    lVar10 = 8L << (bVar4 - 1 & 0x3f);
    diy_fp.f_ = (ulong)(uVar11 + iVar3);
    uVar2 = uVar12 + lVar10;
    diy_fp._8_8_ = uVar13;
    dVar16 = (double)Double::DiyFpToUint64
                               ((Double *)
                                (((uVar9 >> (bVar4 & 0x3f)) + 1) - (ulong)(uVar14 < uVar2)),diy_fp);
    *pdVar7 = dVar16;
    if (lVar10 - uVar12 < uVar14) {
      if (uVar14 < uVar2) {
        return INFINITY <= dVar16;
      }
      return true;
    }
    return true;
  }
LAB_00440ec0:
  *pdVar7 = 0.0;
  return true;
}

Assistant:

static bool ComputeGuess(Vector<const char> trimmed, int exponent,
                         double* guess) {
  if (trimmed.length() == 0) {
    *guess = 0.0;
    return true;
  }
  if (exponent + trimmed.length() - 1 >= kMaxDecimalPower) {
    *guess = Double::Infinity();
    return true;
  }
  if (exponent + trimmed.length() <= kMinDecimalPower) {
    *guess = 0.0;
    return true;
  }

  if (DoubleStrtod(trimmed, exponent, guess) ||
      DiyFpStrtod(trimmed, exponent, guess)) {
    return true;
  }
  if (*guess == Double::Infinity()) {
    return true;
  }
  return false;
}